

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_statistics.h
# Opt level: O3

double __thiscall embree::BVHNStatistics<8>::Statistics::fillRate(Statistics *this,BVH *bvh)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  auVar17._0_8_ = (this->statLeaf).numPrimsActive;
  auVar17._8_8_ = (this->statLeaf).numPrimsTotal;
  auVar13 = ZEXT816(0) << 0x40;
  auVar1 = vblendps_avx(auVar17,auVar13,10);
  auVar15._8_8_ = 0x4330000000000000;
  auVar15._0_8_ = 0x4330000000000000;
  auVar1 = vorps_avx(auVar1,auVar15);
  auVar17 = vpsrlq_avx(auVar17,0x20);
  auVar16._8_8_ = 0x4530000000000000;
  auVar16._0_8_ = 0x4530000000000000;
  auVar17 = vpor_avx(auVar17,auVar16);
  auVar18._8_8_ = 0x4530000000100000;
  auVar18._0_8_ = 0x4530000000100000;
  auVar7 = vsubpd_avx(auVar17,auVar18);
  auVar14 = vpinsrq_avx(*(undefined1 (*) [16])&(this->statAABBNodes).numChildren,
                        (this->statAABBNodes).numNodes << 3,1);
  auVar17 = vpblendw_avx(auVar14,auVar13,0xcc);
  auVar2 = vpor_avx(auVar17,auVar15);
  auVar17 = vpsrlq_avx(auVar14,0x20);
  auVar17 = vpor_avx(auVar17,auVar16);
  auVar8 = vsubpd_avx(auVar17,auVar18);
  auVar14 = vpinsrq_avx(*(undefined1 (*) [16])&(this->statOBBNodes).numChildren,
                        (this->statOBBNodes).numNodes << 3,1);
  auVar17 = vpblendw_avx(auVar14,auVar13,0xcc);
  auVar3 = vpor_avx(auVar17,auVar15);
  auVar17 = vpsrlq_avx(auVar14,0x20);
  auVar17 = vpor_avx(auVar17,auVar16);
  auVar9 = vsubpd_avx(auVar17,auVar18);
  auVar14 = vpinsrq_avx(*(undefined1 (*) [16])&(this->statAABBNodesMB).numChildren,
                        (this->statAABBNodesMB).numNodes << 3,1);
  auVar17 = vpblendw_avx(auVar14,auVar13,0xcc);
  auVar4 = vpor_avx(auVar17,auVar15);
  auVar17 = vpsrlq_avx(auVar14,0x20);
  auVar17 = vpor_avx(auVar17,auVar16);
  auVar10 = vsubpd_avx(auVar17,auVar18);
  auVar14 = vpinsrq_avx(*(undefined1 (*) [16])&(this->statAABBNodesMB4D).numChildren,
                        (this->statAABBNodesMB4D).numNodes << 3,1);
  auVar17 = vpblendw_avx(auVar14,auVar13,0xcc);
  auVar5 = vpor_avx(auVar17,auVar15);
  auVar17 = vpsrlq_avx(auVar14,0x20);
  auVar17 = vpor_avx(auVar17,auVar16);
  auVar11 = vsubpd_avx(auVar17,auVar18);
  auVar14 = vpinsrq_avx(*(undefined1 (*) [16])&(this->statOBBNodesMB).numChildren,
                        (this->statOBBNodesMB).numNodes << 3,1);
  auVar17 = vpblendw_avx(auVar14,auVar13,0xcc);
  auVar6 = vpor_avx(auVar17,auVar15);
  auVar17 = vpsrlq_avx(auVar14,0x20);
  auVar17 = vpor_avx(auVar17,auVar16);
  auVar12 = vsubpd_avx(auVar17,auVar18);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (this->statQuantizedNodes).numChildren;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = (this->statQuantizedNodes).numNodes << 3;
  auVar14 = vpunpcklqdq_avx(auVar14,auVar19);
  auVar17 = vpblendw_avx(auVar14,auVar13,0xcc);
  auVar17 = vpor_avx(auVar17,auVar15);
  auVar14 = vpsrlq_avx(auVar14,0x20);
  auVar14 = vpor_avx(auVar14,auVar16);
  auVar14 = vsubpd_avx(auVar14,auVar18);
  auVar13._0_8_ =
       auVar1._0_8_ + auVar7._0_8_ + auVar2._0_8_ + auVar8._0_8_ + auVar3._0_8_ + auVar9._0_8_ +
       auVar4._0_8_ + auVar10._0_8_ + auVar5._0_8_ + auVar11._0_8_ + auVar6._0_8_ + auVar12._0_8_ +
       auVar17._0_8_ + auVar14._0_8_;
  auVar13._8_8_ =
       auVar1._8_8_ + auVar7._8_8_ + auVar2._8_8_ + auVar8._8_8_ + auVar3._8_8_ + auVar9._8_8_ +
       auVar4._8_8_ + auVar10._8_8_ + auVar5._8_8_ + auVar11._8_8_ + auVar6._8_8_ + auVar12._8_8_ +
       auVar17._8_8_ + auVar14._8_8_;
  auVar17 = vshufpd_avx(auVar13,auVar13,1);
  return auVar13._0_8_ / auVar17._0_8_;
}

Assistant:

double fillRateNom () const { return double(numChildren);  }